

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

void lzma_mf_bt4_skip(lzma_mf *mf,uint32_t amount)

{
  uint uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t pos;
  uint len_limit;
  uint uVar5;
  uint uVar6;
  
  do {
    uVar1 = mf->read_pos;
    uVar4 = mf->write_pos - uVar1;
    len_limit = mf->nice_len;
    if (uVar4 < mf->nice_len) {
      if (uVar4 < 4) {
        if (mf->action == LZMA_RUN) {
          __assert_fail("mf->action != LZMA_RUN",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                        ,800,"void lzma_mf_bt4_skip(lzma_mf *, uint32_t)");
        }
      }
      else {
        len_limit = uVar4;
        if (mf->action != LZMA_SYNC_FLUSH) goto LAB_005c35c6;
      }
      move_pending(mf);
    }
    else {
LAB_005c35c6:
      puVar2 = mf->buffer;
      puVar3 = mf->hash;
      pos = mf->offset + uVar1;
      uVar6 = (uint)puVar2[(ulong)uVar1 + 1] ^ lzma_crc32_table[0][puVar2[uVar1]];
      uVar5 = (uint)puVar2[(ulong)uVar1 + 2] << 8 ^ uVar6;
      uVar4 = ((lzma_crc32_table[0][puVar2[(ulong)uVar1 + 3]] << 5 ^ uVar5) & mf->hash_mask) +
              0x10400;
      cur_match = puVar3[uVar4];
      puVar3[uVar6 & 0x3ff] = pos;
      puVar3[(ulong)(uVar5 & 0xffff) + 0x400] = pos;
      puVar3[uVar4] = pos;
      bt_skip_func(len_limit,pos,puVar2 + uVar1,cur_match,mf->depth,mf->son,mf->cyclic_pos,
                   mf->cyclic_size);
      move_pos(mf);
    }
    amount = amount - 1;
    if (amount == 0) {
      return;
    }
  } while( true );
}

Assistant:

extern void
lzma_mf_bt4_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		const uint8_t *cur;
		uint32_t pos;
		uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
		uint32_t cur_match;

		header_skip(true, 4);

		hash_4_calc();

		cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
		mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

		bt_skip();

	} while (--amount != 0);
}